

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

ostream * operator<<(ostream *os,ChainstateRole *role)

{
  ChainstateRole CVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CVar1 = *role;
  if (CVar1 == ASSUMEDVALID) {
    pcVar4 = "assumedvalid";
    lVar3 = 0xc;
  }
  else if (CVar1 == BACKGROUND) {
    pcVar4 = "background";
    lVar3 = 10;
  }
  else {
    if (CVar1 != NORMAL) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      goto LAB_00487d72;
    }
    pcVar4 = "normal";
    lVar3 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
LAB_00487d72:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ChainstateRole& role) {
    switch(role) {
        case ChainstateRole::NORMAL: os << "normal"; break;
        case ChainstateRole::ASSUMEDVALID: os << "assumedvalid"; break;
        case ChainstateRole::BACKGROUND: os << "background"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}